

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Morse.hpp
# Opt level: O2

void __thiscall OpenMD::Morse::~Morse(Morse *this)

{
  ~Morse(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

void setForceField(ForceField* ff) { forceField_ = ff; }